

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

char * __thiscall DnsStats::GetZonePrefix(DnsStats *this,char *dnsName)

{
  uint uVar1;
  uint uVar2;
  DnsPrefixEntry *pDVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  DnsPrefixEntry dpe;
  uint local_58;
  uint local_54;
  DnsPrefixEntry local_50;
  
  DnsPrefixEntry::DnsPrefixEntry(&local_50);
  if ((this->dnsPrefixTable).tableSize == 0) {
    LoadPrefixTable_from_memory(this);
  }
  if (dnsName == (char *)0x0) {
LAB_001629a7:
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)0x0;
    if (*dnsName != '.') {
      lVar6 = 0;
      local_58 = 0xffffffff;
      local_54 = 0;
      pcVar8 = dnsName;
      uVar1 = 0xffffffff;
      do {
        uVar2 = uVar1;
        uVar4 = (ulong)uVar2;
        local_50.hash = 0;
        local_50.dnsPrefix = pcVar8;
        pDVar3 = BinHash<DnsPrefixEntry>::Retrieve(&this->dnsPrefixTable,&local_50);
        if (pDVar3 != (DnsPrefixEntry *)0x0) {
          pcVar7 = pcVar8;
          if (pDVar3->dnsPrefixClass != DnsPrefixException) {
            if (pDVar3->dnsPrefixClass == DnsPrefixOneLevel) {
              if ((int)local_58 < 0) goto LAB_001629a7;
              uVar4 = (ulong)local_58;
            }
            else if ((int)uVar2 < 0) goto LAB_001629a7;
            pcVar7 = dnsName + uVar4;
          }
          break;
        }
        while( true ) {
          if (dnsName[lVar6] == '\0') {
            pcVar7 = (char *)0x0;
            if (-1 < (int)uVar2) {
              pcVar7 = dnsName + uVar4;
            }
            goto LAB_001629aa;
          }
          if (dnsName[lVar6] == '.') break;
          lVar6 = lVar6 + 1;
        }
        uVar5 = (int)lVar6 + 1;
        lVar6 = (long)(int)uVar5;
        pcVar8 = dnsName + lVar6;
        pcVar7 = (char *)0x0;
        uVar1 = local_54;
        local_58 = uVar2;
        local_54 = uVar5;
      } while (dnsName[lVar6] != '.');
    }
  }
LAB_001629aa:
  DnsPrefixEntry::~DnsPrefixEntry(&local_50);
  return pcVar7;
}

Assistant:

const char * DnsStats::GetZonePrefix(const char * dnsName)
{
    const char * ret = NULL;
    DnsPrefixEntry dpe;
    DnsPrefixEntry * retrieved;
    int prefixOffset = 0;
    int previousOffset = -1;
    int previousPreviousOffset = -1;

    if (dnsPrefixTable.GetSize() == 0) {
        LoadPrefixTable_from_memory();
    }

    while (ret == NULL && dnsName != NULL && dnsName[prefixOffset] != '.') {
        dpe.dnsPrefix = (char *)(dnsName + prefixOffset);
        dpe.hash = 0;

        if ((retrieved = dnsPrefixTable.Retrieve(&dpe)) != NULL)
        {
            switch (retrieved->dnsPrefixClass) {
            case DnsPrefixOneLevel:
                if (previousPreviousOffset >= 0) {
                    ret = dnsName + previousPreviousOffset;
                }
                break;
            case DnsPrefixException:
                ret = dnsName + prefixOffset;
                break;
            case DnsPrefixStd:
            default:
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            }
            break;
        } else {
            int offset = prefixOffset;

            while (dnsName[offset] != 0 && dnsName[offset] != '.') {
                offset++;
            }

            if (dnsName[offset] == 0) {
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            } else {
                previousPreviousOffset = previousOffset;
                previousOffset = prefixOffset;
                prefixOffset = offset + 1; /* Add 1 to skip the dot */
            }
        }
    }

    return ret;
}